

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::anon_unknown_24::DescriptorsByNameEq<google::protobuf::Descriptor>::operator()
          (DescriptorsByNameEq<google::protobuf::Descriptor> *this,Descriptor *lhs,Descriptor *rhs)

{
  ushort uVar1;
  ushort uVar2;
  ushort *puVar3;
  int iVar4;
  ulong __n;
  bool bVar5;
  
  bVar5 = true;
  if ((Descriptor *)this != lhs) {
    uVar1 = **(ushort **)(this + 0x10);
    __n = (ulong)uVar1;
    puVar3 = (ushort *)(lhs->all_names_).payload_;
    uVar2 = *puVar3;
    if (uVar1 != uVar2) {
      return false;
    }
    if (__n != 0) {
      iVar4 = bcmp((void *)((long)*(ushort **)(this + 0x10) + ~__n),
                   (void *)((long)puVar3 + ~(ulong)uVar2),__n);
      bVar5 = iVar4 == 0;
    }
  }
  return bVar5;
}

Assistant:

bool operator()(const DescriptorT* lhs, const DescriptorT* rhs) const {
    return lhs == rhs || lhs->name() == rhs->name();
  }